

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_subject_alt_name_ext
              (uchar **p,uchar *end,mbedtls_x509_sequence *subject_alt_name)

{
  byte bVar1;
  mbedtls_x509_sequence *pmVar2;
  int iVar3;
  mbedtls_x509_sequence *pmVar4;
  byte *pbVar5;
  undefined1 auStack_a8 [8];
  mbedtls_x509_subject_alternative_name tmp_san_name;
  size_t tag_len;
  undefined1 auStack_48 [8];
  mbedtls_x509_buf tmp_san_buf;
  
  pbVar5 = *p;
  pmVar2 = subject_alt_name;
  while( true ) {
    if (end <= pbVar5) {
      pmVar2->next = (mbedtls_asn1_sequence *)0x0;
      iVar3 = -0x2566;
      if (*p == end) {
        iVar3 = 0;
      }
      return iVar3;
    }
    auStack_a8 = (undefined1  [8])0x0;
    tmp_san_name.type = 0;
    tmp_san_name._4_4_ = 0;
    tmp_san_name.san._0_8_ = 0;
    tmp_san_name.san.other_name.type_id.len = 0;
    tmp_san_name.san.other_name.type_id.p = (uchar *)0x0;
    tmp_san_name.san._24_8_ = 0;
    tmp_san_name.san.directory_name.val.len = 0;
    tmp_san_name.san.directory_name.val.p = (uchar *)0x0;
    tmp_san_name.san.directory_name.next = (mbedtls_asn1_named_data *)0x0;
    tmp_san_name.san._56_8_ = 0;
    bVar1 = *pbVar5;
    *p = pbVar5 + 1;
    auStack_48._0_4_ = (uint)bVar1;
    iVar3 = mbedtls_asn1_get_len(p,end,(size_t *)((long)&tmp_san_name.san + 0x40));
    if (iVar3 != 0) {
      return iVar3 + -0x2500;
    }
    tmp_san_buf.len = (size_t)*p;
    tmp_san_buf._0_8_ = tmp_san_name.san._64_8_;
    if ((bVar1 & 0xffffffc0) != 0x80) {
      return -0x2562;
    }
    iVar3 = mbedtls_x509_parse_subject_alt_name
                      ((mbedtls_x509_buf *)auStack_48,
                       (mbedtls_x509_subject_alternative_name *)auStack_a8);
    if ((iVar3 != -0x2080) && (iVar3 != 0)) break;
    if (auStack_a8._0_4_ == 4) {
      mbedtls_asn1_free_named_data_list_shallow
                ((mbedtls_asn1_named_data *)tmp_san_name.san.directory_name.val.p);
    }
    pmVar4 = pmVar2;
    if ((pmVar2->buf).p != (uchar *)0x0) {
      if (pmVar2->next != (mbedtls_asn1_sequence *)0x0) {
        return -0x2500;
      }
      pmVar4 = (mbedtls_x509_sequence *)calloc(1,0x20);
      pmVar2->next = pmVar4;
      if (pmVar4 == (mbedtls_asn1_sequence *)0x0) {
        return -0x256a;
      }
    }
    (pmVar4->buf).p = (uchar *)tmp_san_buf.len;
    *(ulong *)&pmVar4->buf = CONCAT44(auStack_48._4_4_,auStack_48._0_4_);
    (pmVar4->buf).len = tmp_san_buf._0_8_;
    pbVar5 = *p + tmp_san_buf._0_8_;
    *p = pbVar5;
    pmVar2 = pmVar4;
  }
  mbedtls_asn1_sequence_free(subject_alt_name->next);
  subject_alt_name->next = (mbedtls_asn1_sequence *)0x0;
  return iVar3;
}

Assistant:

int mbedtls_x509_get_subject_alt_name_ext(unsigned char **p,
                                          const unsigned char *end,
                                          mbedtls_x509_sequence *subject_alt_name)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t tag_len;
    mbedtls_asn1_sequence *cur = subject_alt_name;

    while (*p < end) {
        mbedtls_x509_subject_alternative_name tmp_san_name;
        mbedtls_x509_buf tmp_san_buf;
        memset(&tmp_san_name, 0, sizeof(tmp_san_name));

        tmp_san_buf.tag = **p;
        (*p)++;

        if ((ret = mbedtls_asn1_get_len(p, end, &tag_len)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        tmp_san_buf.p = *p;
        tmp_san_buf.len = tag_len;

        if ((tmp_san_buf.tag & MBEDTLS_ASN1_TAG_CLASS_MASK) !=
            MBEDTLS_ASN1_CONTEXT_SPECIFIC) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
        }

        /*
         * Check that the SAN is structured correctly by parsing it.
         * The SAN structure is discarded afterwards.
         */
        ret = mbedtls_x509_parse_subject_alt_name(&tmp_san_buf, &tmp_san_name);
        /*
         * In case the extension is malformed, return an error,
         * and clear the allocated sequences.
         */
        if (ret != 0 && ret != MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
            mbedtls_asn1_sequence_free(subject_alt_name->next);
            subject_alt_name->next = NULL;
            return ret;
        }

        mbedtls_x509_free_subject_alt_name(&tmp_san_name);
        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        cur->buf = tmp_san_buf;
        *p += tmp_san_buf.len;
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}